

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O2

void __thiscall simdjson::fallback::ondemand::value_iterator::assert_at_child(value_iterator *this)

{
  if ((this->_json_iter->token)._position <= this->_start_position) {
    __assert_fail("_json_iter->token._position > _start_position",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x6781,
                  "void simdjson::fallback::ondemand::value_iterator::assert_at_child() const");
  }
  if (this->_json_iter->_depth == this->_depth + 1) {
    if (0 < this->_depth) {
      return;
    }
    __assert_fail("_depth > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x6783,
                  "void simdjson::fallback::ondemand::value_iterator::assert_at_child() const");
  }
  __assert_fail("_json_iter->_depth == _depth + 1",
                "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                ,0x6782,"void simdjson::fallback::ondemand::value_iterator::assert_at_child() const"
               );
}

Assistant:

inline void value_iterator::assert_at_child() const noexcept {
  SIMDJSON_ASSUME( _json_iter->token._position > _start_position );
  SIMDJSON_ASSUME( _json_iter->_depth == _depth + 1 );
  SIMDJSON_ASSUME( _depth > 0 );
}